

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  nullres nVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char *code;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  FILE *pFVar10;
  char *pcVar11;
  bool bVar12;
  char *local_1a00;
  FILE *nmcFile;
  char newName [1024];
  char *pos_2;
  char *extensionPos;
  char moduleName [1024];
  uint *local_11c0;
  uint *bytecode;
  char *fileContent_1;
  FILE *pFStack_11a8;
  uint textSize_1;
  FILE *ncFile_1;
  char *fileName_1;
  char *pcStack_1190;
  int currIndex;
  char *pos_1;
  char tmp [256];
  char *dependency;
  char **ppcStack_1070;
  uint i;
  char *pos;
  char cmdLine [4096];
  char *fileContent;
  uint textSize;
  FILE *ncFile;
  char *fileName;
  char *outputName;
  char *folder;
  bool link;
  FILE *pFStack_28;
  bool verbose;
  FILE *mergeFile;
  int argIndex;
  char **argv_local;
  int argc_local;
  
  nullcInit();
  nullcAddImportPath("Modules/");
  if (argc == 1) {
    printf(
          "usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]\n"
          );
    printf("usage: nullcl -c [-i import_folder] output.cpp file.nc\n");
    printf("usage: nullcl -x [-i import_folder] output.exe file.nc\n");
    return 1;
  }
  mergeFile._4_4_ = 1;
  pFStack_28 = (FILE *)0x0;
  iVar3 = strcmp("-v",argv[1]);
  if (iVar3 == 0) {
    mergeFile._4_4_ = 2;
  }
  iVar4 = strcmp("-o",argv[mergeFile._4_4_]);
  if (iVar4 == 0) {
    iVar3 = mergeFile._4_4_ + 1;
    if (iVar3 == argc) {
      printf("Output file name not found after -o\n");
      nullcTerminate();
      return 1;
    }
    pFStack_28 = fopen(argv[iVar3],"wb");
    if (pFStack_28 == (FILE *)0x0) {
      printf("Cannot create output file %s\n",argv[iVar3]);
      nullcTerminate();
      return 1;
    }
    mergeFile._4_4_ = mergeFile._4_4_ + 2;
  }
  else {
    iVar4 = strcmp("-c",argv[mergeFile._4_4_]);
    if ((iVar4 == 0) || (iVar4 = strcmp("-x",argv[mergeFile._4_4_]), iVar4 == 0)) {
      iVar4 = strcmp("-x",argv[mergeFile._4_4_]);
      mergeFile._4_4_ = mergeFile._4_4_ + 1;
      while( true ) {
        bVar12 = false;
        if (mergeFile._4_4_ < argc) {
          iVar5 = strcmp("-i",argv[mergeFile._4_4_]);
          bVar12 = iVar5 == 0;
        }
        if (!bVar12) break;
        iVar5 = mergeFile._4_4_ + 1;
        if (iVar5 == argc) {
          printf("Missing folder name after -i\n");
          nullcTerminate();
          return 1;
        }
        mergeFile._4_4_ = mergeFile._4_4_ + 2;
        nullcAddImportPath(argv[iVar5]);
      }
      if (mergeFile._4_4_ == argc) {
        printf("Output file name not found after options\n");
        nullcTerminate();
        return 1;
      }
      pcVar8 = argv[mergeFile._4_4_];
      if (mergeFile._4_4_ + 1 == argc) {
        printf("Input file name not found after output file name\n");
        nullcTerminate();
        return 1;
      }
      pcVar11 = argv[mergeFile._4_4_ + 1];
      pFVar10 = fopen(pcVar11,"rb");
      if (pFVar10 == (FILE *)0x0) {
        printf("Cannot open file %s\n",pcVar11);
        nullcTerminate();
        return 1;
      }
      fseek(pFVar10,0,2);
      uVar6 = ftell(pFVar10);
      fseek(pFVar10,0,0);
      code = (char *)operator_new__((ulong)((int)uVar6 + 1));
      fread(code,1,uVar6 & 0xffffffff,pFVar10);
      code[uVar6 & 0xffffffff] = '\0';
      fclose(pFVar10);
      nVar2 = nullcCompile(code);
      if (nVar2 == '\0') {
        pcVar8 = nullcGetLastError();
        printf("Compilation of %s failed with error:\n%s\n",pcVar11,pcVar8);
        if (code != (char *)0x0) {
          operator_delete__(code);
        }
        return 1;
      }
      local_1a00 = pcVar8;
      if (iVar4 == 0) {
        local_1a00 = "__temp.cpp";
      }
      nVar2 = nullcTranslateToC(local_1a00,"main",AddDependency);
      if (nVar2 == '\0') {
        pcVar8 = nullcGetLastError();
        printf("Compilation of %s failed with error:\n%s\n",pcVar11,pcVar8);
        if (code != (char *)0x0) {
          operator_delete__(code);
        }
        return 1;
      }
      if (iVar4 == 0) {
        ppcStack_1070 = &pos;
        strcpy((char *)ppcStack_1070,"gcc -g -o ");
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)(sVar9 + (long)ppcStack_1070);
        strcpy((char *)ppcStack_1070,pcVar8);
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
        strcpy((char *)ppcStack_1070," __temp.cpp");
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
        strcpy((char *)ppcStack_1070," -Itranslation");
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
        strcpy((char *)ppcStack_1070," -INULLC/translation");
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
        strcpy((char *)ppcStack_1070," -I../NULLC/translation");
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
        strcpy((char *)ppcStack_1070," -O2");
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
        bVar12 = SearchAndAddSourceFile((char **)&stack0xffffffffffffef90,"runtime.cpp");
        if (!bVar12) {
          printf("Failed to find \'runtime.cpp\' input file\n");
        }
        for (dependency._4_4_ = 0; dependency._4_4_ < translationDependencyCount;
            dependency._4_4_ = dependency._4_4_ + 1) {
          pcVar8 = translationDependencies[dependency._4_4_];
          pcVar11 = (char *)((long)ppcStack_1070 + 1);
          *(char *)ppcStack_1070 = ' ';
          ppcStack_1070 = (char **)pcVar11;
          strcpy(pcVar11,pcVar8);
          sVar9 = strlen((char *)ppcStack_1070);
          ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
          pcVar11 = strstr(pcVar8,"import_");
          if (pcVar11 != (char *)0x0) {
            format((char *)&pos_1,0x100,"%s",pcVar8 + 7);
            pcStack_1190 = strstr((char *)&pos_1,"_nc.cpp");
            if (pcStack_1190 != (char *)0x0) {
              strcpy(pcStack_1190,"_bind.cpp");
            }
            bVar12 = SearchAndAddSourceFile((char **)&stack0xffffffffffffef90,(char *)&pos_1);
            if (!bVar12) {
              printf("Failed to find \'%s\' input file\n",&pos_1);
            }
          }
        }
        strcpy((char *)ppcStack_1070," -lstdc++ -lm");
        sVar9 = strlen((char *)ppcStack_1070);
        ppcStack_1070 = (char **)((long)ppcStack_1070 + sVar9);
        if (iVar3 == 0) {
          printf("Command line: %s\n",&pos);
        }
        system((char *)&pos);
      }
      if (code != (char *)0x0) {
        operator_delete__(code);
      }
      nullcTerminate();
      return 0;
    }
  }
  fileName_1._4_4_ = mergeFile._4_4_;
  do {
    if (argc <= mergeFile._4_4_) {
LAB_0010aa44:
      if (fileName_1._4_4_ == mergeFile._4_4_) {
        printf("None of the input files were found\n");
      }
      if (pFStack_28 != (FILE *)0x0) {
        fclose(pFStack_28);
      }
      nullcTerminate();
      return (uint)(mergeFile._4_4_ != argc);
    }
    iVar3 = mergeFile._4_4_ + 1;
    ncFile_1 = (FILE *)argv[mergeFile._4_4_];
    pFStack_11a8 = fopen((char *)ncFile_1,"rb");
    if (pFStack_11a8 == (FILE *)0x0) {
      printf("Cannot open file %s\n",ncFile_1);
      mergeFile._4_4_ = iVar3;
      goto LAB_0010aa44;
    }
    fseek(pFStack_11a8,0,2);
    lVar7 = ftell(pFStack_11a8);
    fileContent_1._4_4_ = (uint)lVar7;
    fseek(pFStack_11a8,0,0);
    bytecode = (uint *)operator_new__((ulong)(fileContent_1._4_4_ + 1));
    fread(bytecode,1,(ulong)fileContent_1._4_4_,pFStack_11a8);
    *(undefined1 *)((long)bytecode + (ulong)fileContent_1._4_4_) = 0;
    fclose(pFStack_11a8);
    nVar2 = nullcCompile((char *)bytecode);
    pFVar1 = ncFile_1;
    if (nVar2 == '\0') {
      pcVar8 = nullcGetLastError();
      printf("Compilation of %s failed with error:\n%s\n",pFVar1,pcVar8);
      if (bytecode != (uint *)0x0) {
        operator_delete__(bytecode);
      }
      nullcTerminate();
      return 1;
    }
    local_11c0 = (uint *)0x0;
    nullcGetBytecode((char **)&local_11c0);
    if (bytecode != (uint *)0x0) {
      operator_delete__(bytecode);
    }
    if ((iVar3 < argc) && (iVar4 = strcmp("-m",argv[iVar3]), iVar4 == 0)) {
      iVar3 = mergeFile._4_4_ + 2;
      if (iVar3 == argc) {
        printf("Module name not found after -m\n");
        mergeFile._4_4_ = iVar3;
        if (local_11c0 != (uint *)0x0) {
          operator_delete__(local_11c0);
        }
        goto LAB_0010aa44;
      }
      sVar9 = strlen(argv[iVar3]);
      if (0x3ff < sVar9 + 1) {
        printf("Module name is too long\n");
        mergeFile._4_4_ = iVar3;
        if (local_11c0 != (uint *)0x0) {
          operator_delete__(local_11c0);
        }
        goto LAB_0010aa44;
      }
      strcpy((char *)&extensionPos,argv[iVar3]);
      mergeFile._4_4_ = mergeFile._4_4_ + 3;
    }
    else {
      sVar9 = strlen((char *)ncFile_1);
      if (0x3ff < sVar9 + 1) {
        printf("File name is too long\n");
        mergeFile._4_4_ = iVar3;
        if (local_11c0 != (uint *)0x0) {
          operator_delete__(local_11c0);
        }
        goto LAB_0010aa44;
      }
      strcpy((char *)&extensionPos,(char *)ncFile_1);
      pcVar8 = strchr((char *)&extensionPos,0x2e);
      if (pcVar8 != (char *)0x0) {
        *pcVar8 = '\0';
      }
      newName._1016_8_ = &extensionPos;
      while (mergeFile._4_4_ = iVar3, *(char *)newName._1016_8_ != '\0') {
        pcVar11 = (char *)(newName._1016_8_ + 1);
        pcVar8 = pcVar11;
        if ((*(char *)newName._1016_8_ == '\\') ||
           (newName._1016_8_ = newName._1016_8_ + 2, pcVar8 = (char *)newName._1016_8_,
           *pcVar11 == '/')) {
          newName._1016_8_ = pcVar8;
          *(undefined1 *)(newName._1016_8_ + -1) = 0x2e;
        }
      }
    }
    nullcLoadModuleByBinary((char *)&extensionPos,(char *)local_11c0);
    if (pFStack_28 == (FILE *)0x0) {
      sVar9 = strlen((char *)ncFile_1);
      if (0x3fe < sVar9 + 1) {
        printf("File name is too long\n");
        if (local_11c0 != (uint *)0x0) {
          operator_delete__(local_11c0);
        }
        goto LAB_0010aa44;
      }
      strcpy((char *)&nmcFile,(char *)ncFile_1);
      strcat((char *)&nmcFile,"m");
      pFVar10 = fopen((char *)&nmcFile,"wb");
      if (pFVar10 == (FILE *)0x0) {
        printf("Cannot create output file %s\n",&nmcFile);
        if (local_11c0 != (uint *)0x0) {
          operator_delete__(local_11c0);
        }
        goto LAB_0010aa44;
      }
      sVar9 = strlen((char *)&extensionPos);
      fwrite(&extensionPos,1,sVar9 + 1,pFVar10);
      fwrite(local_11c0,1,(ulong)*local_11c0,pFVar10);
      fclose(pFVar10);
    }
    else {
      sVar9 = strlen((char *)&extensionPos);
      fwrite(&extensionPos,1,sVar9 + 1,pFStack_28);
      fwrite(local_11c0,1,(ulong)*local_11c0,pFStack_28);
    }
    if (local_11c0 != (uint *)0x0) {
      operator_delete__(local_11c0);
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
	nullcInit();
	nullcAddImportPath("Modules/");

	if(argc == 1)
	{
		printf("usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]\n");
		printf("usage: nullcl -c [-i import_folder] output.cpp file.nc\n");
		printf("usage: nullcl -x [-i import_folder] output.exe file.nc\n");
		return 1;
	}

	int argIndex = 1;
	FILE *mergeFile = NULL;
	bool verbose = false;

	if(strcmp("-v", argv[argIndex]) == 0)
	{
		argIndex++;

		verbose = true;
	}

	if(strcmp("-o", argv[argIndex]) == 0)
	{
		argIndex++;
		if(argIndex == argc)
		{
			printf("Output file name not found after -o\n");
			nullcTerminate();
			return 1;
		}
		mergeFile = fopen(argv[argIndex], "wb");
		if(!mergeFile)
		{
			printf("Cannot create output file %s\n", argv[argIndex]);
			nullcTerminate();
			return 1;
		}
		argIndex++;
	}else if(strcmp("-c", argv[argIndex]) == 0 || strcmp("-x", argv[argIndex]) == 0){
		bool link = strcmp("-x", argv[argIndex]) == 0;
		argIndex++;

		while(argIndex < argc && strcmp("-i", argv[argIndex]) == 0)
		{
			argIndex++;

			if(argIndex == argc)
			{
				printf("Missing folder name after -i\n");
				nullcTerminate();
				return 1;
			}

			const char* folder = argv[argIndex++];
			nullcAddImportPath(folder);
		}

		if(argIndex == argc)
		{
			printf("Output file name not found after options\n");
			nullcTerminate();
			return 1;
		}

		const char *outputName = argv[argIndex++];

		if(argIndex == argc)
		{
			printf("Input file name not found after output file name\n");
			nullcTerminate();
			return 1;
		}

		const char *fileName = argv[argIndex++];
		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			nullcTerminate();
			return 1;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(!nullcTranslateToC(link ? "__temp.cpp" : outputName, "main", AddDependency))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(link)
		{
			// $$$ move this to a dependency file?
			char cmdLine[4096];

			char *pos = cmdLine;
			strcpy(pos, "gcc -g -o ");
			pos += strlen(pos);

			strcpy(pos, outputName);
			pos += strlen(pos);

			strcpy(pos, " __temp.cpp");
			pos += strlen(pos);

			strcpy(pos, " -Itranslation");
			pos += strlen(pos);

			strcpy(pos, " -INULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -I../NULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -O2");
			pos += strlen(pos);

			if(!SearchAndAddSourceFile(pos, "runtime.cpp"))
				printf("Failed to find 'runtime.cpp' input file\n");

			for(unsigned i = 0; i < translationDependencyCount; i++)
			{
				const char *dependency = translationDependencies[i];

				*(pos++) = ' ';

				strcpy(pos, dependency);
				pos += strlen(pos);

				if(strstr(dependency, "import_"))
				{
					char tmp[256];
					format(tmp, 256, "%s", dependency + strlen("import_"));

					if(char *pos = strstr(tmp, "_nc.cpp"))
						strcpy(pos, "_bind.cpp");

					if(!SearchAndAddSourceFile(pos, tmp))
						printf("Failed to find '%s' input file\n", tmp);
				}
			}

			strcpy(pos, " -lstdc++ -lm");
			pos += strlen(pos);

			if (verbose)
				printf("Command line: %s\n", cmdLine);

			system(cmdLine);
		}
		delete[] fileContent;
		nullcTerminate();
		return 0;
	}
	int currIndex = argIndex;
	while(argIndex < argc)
	{
		const char *fileName = argv[argIndex++];

		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			break;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			nullcTerminate();
			return 1;
		}
		unsigned int *bytecode = NULL;
		nullcGetBytecode((char**)&bytecode);
		delete[] fileContent;

		// Create module name
		char	moduleName[1024];
		if(argIndex < argc && strcmp("-m", argv[argIndex]) == 0)
		{
			argIndex++;
			if(argIndex == argc)
			{
				printf("Module name not found after -m\n");

				delete[] bytecode;
				break;
			}

			if(strlen(argv[argIndex]) + 1 >= 1024)
			{
				printf("Module name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, argv[argIndex]);

			argIndex++;
		}
		else
		{
			if(strlen(fileName) + 1 >= 1024)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, fileName);
			if(char *extensionPos = strchr(moduleName, '.'))
				*extensionPos = '\0';
			char	*pos = moduleName;
			while(*pos)
			{
				if(*pos++ == '\\' || *pos++ == '/')
					pos[-1] = '.';
			}
		}
		nullcLoadModuleByBinary(moduleName, (const char*)bytecode);

		if(!mergeFile)
		{
			char newName[1024];

			// Ont extra character for 'm' appended at the end
			if(strlen(fileName) + 1 >= 1024 - 1)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(newName, fileName);
			strcat(newName, "m");
			FILE *nmcFile = fopen(newName, "wb");
			if(!nmcFile)
			{
				printf("Cannot create output file %s\n", newName);

				delete[] bytecode;
				break;
			}
			fwrite(moduleName, 1, strlen(moduleName) + 1, nmcFile);
			fwrite(bytecode, 1, *bytecode, nmcFile);
			fclose(nmcFile);
		}else{
			fwrite(moduleName, 1, strlen(moduleName) + 1, mergeFile);
			fwrite(bytecode, 1, *bytecode, mergeFile);
		}

		delete[] bytecode;
	}
	if(currIndex == argIndex)
		printf("None of the input files were found\n");

	if(mergeFile)
		fclose(mergeFile);

	nullcTerminate();

	return argIndex != argc;	
}